

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speedtesting.cpp
# Opt level: O2

double hashALot<ThreeWiseHash<unsigned_int,unsigned_char>>
                 (int n,int L,uint ttimes,uint sizeoftest,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *recorder)

{
  uint uVar1;
  uint k;
  int iVar2;
  ZTimer t;
  ThreeWiseHash<unsigned_int,_unsigned_char> hf;
  ZTimer local_4c8;
  ThreeWiseHash<unsigned_int,_unsigned_char> local_4a8;
  
  ZTimer::ZTimer(&local_4c8);
  for (uVar1 = 0; uVar1 != ttimes; uVar1 = uVar1 + 1) {
    ThreeWiseHash<unsigned_int,_unsigned_char>::ThreeWiseHash(&local_4a8,n,L);
    for (iVar2 = 0; n != iVar2; iVar2 = iVar2 + 1) {
      ThreeWiseHash<unsigned_int,_unsigned_char>::eat(&local_4a8,(uchar)iVar2);
    }
    for (iVar2 = 0; (uint)(n + iVar2) < sizeoftest; iVar2 = iVar2 + 1) {
      ThreeWiseHash<unsigned_int,_unsigned_char>::update(&local_4a8,(uchar)iVar2,(uchar)(n + iVar2))
      ;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (recorder,&local_4a8.hashvalue);
    ThreeWiseHash<unsigned_int,_unsigned_char>::~ThreeWiseHash(&local_4a8);
  }
  iVar2 = ZTimer::split(&local_4c8);
  return (double)iVar2 / ((double)ttimes * 1000.0);
}

Assistant:

double hashALot(int n, int L, uint ttimes, uint sizeoftest,
                vector<uint32> &recorder) {
  ZTimer t;
  for (uint times = 0; times < ttimes; ++times) {
    hashfunction hf(n, L);
    for (uint k = 0; k < static_cast<uint>(n); ++k) {
      hf.eat(static_cast<unsigned char>(k));
    }
    for (uint k = n; k < sizeoftest; ++k) {
      hf.update(static_cast<unsigned char>(k - n),
                static_cast<unsigned char>(k));
    }
    /* The goal of the recorder is to prevent
    the compiler from deciding that this whole computation
    is not required!
    */
    recorder.push_back(hf.hashvalue);
  }
  return t.split() / (1000.0 * ttimes);
}